

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::add_rule
          (filter_impl<std::array<unsigned_char,_16UL>_> *this,array<unsigned_char,_16UL> first,
          array<unsigned_char,_16UL> last,uint32_t flags)

{
  array<unsigned_char,_16UL> addr;
  array<unsigned_char,_16UL> addr_00;
  array<unsigned_char,_16UL> addr_01;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  pointer prVar4;
  undefined8 uVar5;
  bool local_1f2;
  bool local_1f1;
  _Self local_1d0;
  _Type local_1c4;
  range local_1b4;
  const_iterator local_1a0;
  _Base_ptr local_198;
  array<unsigned_char,_16UL> local_190;
  _Self local_180;
  array<unsigned_char,_16UL> local_178;
  _Self local_168;
  _Base_ptr local_160;
  uchar local_154 [8];
  undefined8 local_14c;
  range local_144;
  const_iterator local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
  local_100;
  _Self local_f8;
  uchar local_ec [8];
  undefined8 local_e4;
  range local_dc;
  const_iterator local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
  local_b0;
  uint32_t local_a8;
  uint32_t local_a4;
  uint32_t last_access;
  uint32_t first_access;
  filter_impl<std::array<unsigned_char,_16UL>_> *local_94;
  uchar local_8c [8];
  range local_84;
  _Self local_70;
  iterator j;
  range local_54;
  _Self local_40;
  iterator i;
  uint32_t flags_local;
  filter_impl<std::array<unsigned_char,_16UL>_> *this_local;
  array<unsigned_char,_16UL> last_local;
  array<unsigned_char,_16UL> first_local;
  
  last_local._M_elems._0_8_ = last._M_elems._8_8_;
  this_local = last._M_elems._0_8_;
  uVar5 = first._M_elems._8_8_;
  register0x00000030 = first._M_elems._0_8_;
  i._M_node._4_4_ = flags;
  last_local._M_elems._8_8_ = register0x00000030;
  range::range(&local_54,first,0);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
       ::upper_bound(&this->m_access_list,&local_54);
  local_94 = this_local;
  local_8c[0] = last_local._M_elems[0];
  local_8c[1] = last_local._M_elems[1];
  local_8c[2] = last_local._M_elems[2];
  local_8c[3] = last_local._M_elems[3];
  local_8c[4] = last_local._M_elems[4];
  local_8c[5] = last_local._M_elems[5];
  local_8c[6] = last_local._M_elems[6];
  local_8c[7] = last_local._M_elems[7];
  addr_01._M_elems[8] = last_local._M_elems[0];
  addr_01._M_elems[9] = last_local._M_elems[1];
  addr_01._M_elems[10] = last_local._M_elems[2];
  addr_01._M_elems[0xb] = last_local._M_elems[3];
  addr_01._M_elems[0xc] = last_local._M_elems[4];
  addr_01._M_elems[0xd] = last_local._M_elems[5];
  addr_01._M_elems[0xe] = last_local._M_elems[6];
  addr_01._M_elems[0xf] = last_local._M_elems[7];
  addr_01._M_elems._0_8_ = this_local;
  range::range(&local_84,addr_01,0);
  local_70._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
       ::upper_bound(&this->m_access_list,&local_84);
  _last_access = ::std::
                 set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                 ::begin(&this->m_access_list);
  bVar2 = ::std::operator!=(&local_40,(_Self *)&last_access);
  if (bVar2) {
    ::std::
    _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>::
    operator--(&local_40);
  }
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
           ::operator->(&local_40);
  local_a4 = prVar4->access;
  local_b8 = local_70._M_node;
  local_b0 = ::std::
             prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                       (local_70._M_node,1);
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
           ::operator->(&local_b0);
  local_a8 = prVar4->access;
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
           ::operator->(&local_40);
  bVar2 = ::std::operator!=(&prVar4->start,(array<unsigned_char,_16UL> *)(last_local._M_elems + 8));
  if ((bVar2) && (local_a4 != i._M_node._4_4_)) {
    local_c8._M_node = local_40._M_node;
    local_ec[0] = last_local._M_elems[8];
    local_ec[1] = last_local._M_elems[9];
    local_ec[2] = last_local._M_elems[10];
    local_ec[3] = last_local._M_elems[0xb];
    local_ec[4] = last_local._M_elems[0xc];
    local_ec[5] = last_local._M_elems[0xd];
    local_ec[6] = last_local._M_elems[0xe];
    local_ec[7] = last_local._M_elems[0xf];
    addr_00._M_elems[8] = (char)uVar5;
    addr_00._M_elems[9] = (char)((ulong)uVar5 >> 8);
    addr_00._M_elems[10] = (char)((ulong)uVar5 >> 0x10);
    addr_00._M_elems[0xb] = (char)((ulong)uVar5 >> 0x18);
    addr_00._M_elems[0xc] = (char)((ulong)uVar5 >> 0x20);
    addr_00._M_elems[0xd] = (char)((ulong)uVar5 >> 0x28);
    addr_00._M_elems[0xe] = (char)((ulong)uVar5 >> 0x30);
    addr_00._M_elems[0xf] = (char)((ulong)uVar5 >> 0x38);
    addr_00._M_elems[0] = last_local._M_elems[8];
    addr_00._M_elems[1] = last_local._M_elems[9];
    addr_00._M_elems[2] = last_local._M_elems[10];
    addr_00._M_elems[3] = last_local._M_elems[0xb];
    addr_00._M_elems[4] = last_local._M_elems[0xc];
    addr_00._M_elems[5] = last_local._M_elems[0xd];
    addr_00._M_elems[6] = last_local._M_elems[0xe];
    addr_00._M_elems[7] = last_local._M_elems[0xf];
    local_e4 = uVar5;
    range::range(&local_dc,addr_00,i._M_node._4_4_);
    local_c0 = (_Base_ptr)
               ::std::
               set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
               ::insert(&this->m_access_list,local_c8,&local_dc);
    local_40._M_node = local_c0;
  }
  else {
    local_f8._M_node =
         (_Base_ptr)
         ::std::
         set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
         ::begin(&this->m_access_list);
    bVar3 = ::std::operator!=(&local_40,&local_f8);
    bVar2 = false;
    if (bVar3) {
      local_108 = local_40._M_node;
      local_100 = ::std::
                  prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                            (local_40._M_node,1);
      prVar4 = ::std::
               _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
               ::operator->(&local_100);
      bVar2 = prVar4->access == i._M_node._4_4_;
    }
    if (bVar2) {
      ::std::
      _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
      ::operator--(&local_40);
      prVar4 = ::std::
               _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
               ::operator->(&local_40);
      local_a4 = prVar4->access;
    }
  }
  bVar2 = ::std::operator!=(&local_40,&local_70);
  if (bVar2) {
    local_118 = local_40._M_node;
    local_110 = (_Base_ptr)
                ::std::
                next<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                          (local_40._M_node,1);
    local_120 = local_70._M_node;
    local_128 = (_Base_ptr)
                ::std::
                set<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                ::erase_abi_cxx11_((set<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                                    *)this,(const_iterator)local_110,local_70._M_node);
  }
  prVar4 = ::std::
           _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
           ::operator->(&local_40);
  bVar2 = ::std::operator==(&prVar4->start,(array<unsigned_char,_16UL> *)(last_local._M_elems + 8));
  if (bVar2) {
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
             ::operator->(&local_40);
    uVar1 = i._M_node._4_4_;
    *(undefined8 *)(prVar4->start)._M_elems = last_local._M_elems._8_8_;
    *(undefined8 *)((prVar4->start)._M_elems + 8) = uVar5;
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
             ::operator->(&local_40);
    prVar4->access = uVar1;
  }
  else if (local_a4 != i._M_node._4_4_) {
    local_130._M_node = local_40._M_node;
    local_154[0] = last_local._M_elems[8];
    local_154[1] = last_local._M_elems[9];
    local_154[2] = last_local._M_elems[10];
    local_154[3] = last_local._M_elems[0xb];
    local_154[4] = last_local._M_elems[0xc];
    local_154[5] = last_local._M_elems[0xd];
    local_154[6] = last_local._M_elems[0xe];
    local_154[7] = last_local._M_elems[0xf];
    addr._M_elems[8] = (char)uVar5;
    addr._M_elems[9] = (char)((ulong)uVar5 >> 8);
    addr._M_elems[10] = (char)((ulong)uVar5 >> 0x10);
    addr._M_elems[0xb] = (char)((ulong)uVar5 >> 0x18);
    addr._M_elems[0xc] = (char)((ulong)uVar5 >> 0x20);
    addr._M_elems[0xd] = (char)((ulong)uVar5 >> 0x28);
    addr._M_elems[0xe] = (char)((ulong)uVar5 >> 0x30);
    addr._M_elems[0xf] = (char)((ulong)uVar5 >> 0x38);
    addr._M_elems[0] = last_local._M_elems[8];
    addr._M_elems[1] = last_local._M_elems[9];
    addr._M_elems[2] = last_local._M_elems[10];
    addr._M_elems[3] = last_local._M_elems[0xb];
    addr._M_elems[4] = last_local._M_elems[0xc];
    addr._M_elems[5] = last_local._M_elems[0xd];
    addr._M_elems[6] = last_local._M_elems[0xe];
    addr._M_elems[7] = last_local._M_elems[0xf];
    local_14c = uVar5;
    range::range(&local_144,addr,i._M_node._4_4_);
    local_160 = (_Base_ptr)
                ::std::
                set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                ::insert(&this->m_access_list,local_130,&local_144);
  }
  local_168._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
       ::end(&this->m_access_list);
  bVar2 = ::std::operator!=(&local_70,&local_168);
  if (bVar2) {
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
             ::operator->(&local_70);
    local_178 = minus_one<std::array<unsigned_char,16ul>>(&prVar4->start);
    bVar2 = ::std::operator!=(&local_178,(array<unsigned_char,_16UL> *)&this_local);
    local_1f1 = true;
    if (bVar2) goto LAB_003cde98;
  }
  local_180._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
       ::end(&this->m_access_list);
  bVar2 = ::std::operator==(&local_70,&local_180);
  local_1f2 = false;
  if (bVar2) {
    local_190 = max_addr<std::array<unsigned_char,16ul>>();
    local_1f2 = ::std::operator!=((array<unsigned_char,_16UL> *)&this_local,&local_190);
  }
  local_1f1 = local_1f2;
LAB_003cde98:
  if ((local_1f1 != false) && (local_a8 != i._M_node._4_4_)) {
    local_1a0._M_node = local_70._M_node;
    local_1c4 = (_Type)plus_one<std::array<unsigned_char,16ul>>
                                 ((array<unsigned_char,_16UL> *)&this_local);
    range::range(&local_1b4,(array<unsigned_char,_16UL>)local_1c4,local_a8);
    local_198 = (_Base_ptr)
                ::std::
                set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                ::insert(&this->m_access_list,local_1a0,&local_1b4);
    local_70._M_node = local_198;
  }
  local_1d0._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
       ::end(&this->m_access_list);
  bVar3 = ::std::operator!=(&local_70,&local_1d0);
  bVar2 = false;
  if (bVar3) {
    prVar4 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
             ::operator->(&local_70);
    bVar2 = prVar4->access == i._M_node._4_4_;
  }
  if (bVar2) {
    ::std::
    set<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
    ::erase_abi_cxx11_((set<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                        *)this,(const_iterator)local_70._M_node);
  }
  return;
}

Assistant:

void filter_impl<Addr>::add_rule(Addr first, Addr last, std::uint32_t const flags)
	{
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(first < last || first == last);

		auto i = m_access_list.upper_bound(first);
		auto j = m_access_list.upper_bound(last);

		if (i != m_access_list.begin()) --i;

		TORRENT_ASSERT(j != m_access_list.begin());
		TORRENT_ASSERT(j != i);

		std::uint32_t first_access = i->access;
		std::uint32_t last_access = std::prev(j)->access;

		if (i->start != first && first_access != flags)
		{
			i = m_access_list.insert(i, range(first, flags));
		}
		else if (i != m_access_list.begin() && std::prev(i)->access == flags)
		{
			--i;
			first_access = i->access;
		}
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(i != m_access_list.end());

		if (i != j) m_access_list.erase(std::next(i), j);
		if (i->start == first)
		{
			// This is an optimization over erasing and inserting a new element
			// here.
			// this const-cast is OK because we know that the new
			// start address will keep the set correctly ordered
			const_cast<Addr&>(i->start) = first;
			const_cast<std::uint32_t&>(i->access) = flags;
		}
		else if (first_access != flags)
		{
			m_access_list.insert(i, range(first, flags));
		}

		if ((j != m_access_list.end()
				&& minus_one(j->start) != last)
			|| (j == m_access_list.end()
				&& last != max_addr<Addr>()))
		{
			TORRENT_ASSERT(j == m_access_list.end() || last < minus_one(j->start));
			if (last_access != flags)
				j = m_access_list.insert(j, range(plus_one(last), last_access));
		}

		if (j != m_access_list.end() && j->access == flags) m_access_list.erase(j);
		TORRENT_ASSERT(!m_access_list.empty());
	}